

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall
TypeTest_CanonicalizeExactRefs_Test::TypeTest_CanonicalizeExactRefs_Test
          (TypeTest_CanonicalizeExactRefs_Test *this)

{
  TypeTest_CanonicalizeExactRefs_Test *this_local;
  
  TypeTest::TypeTest(&this->super_TypeTest);
  (this->super_TypeTest).super_Test._vptr_Test =
       (_func_int **)&PTR__TypeTest_CanonicalizeExactRefs_Test_00573b28;
  return;
}

Assistant:

TEST_F(TypeTest, CanonicalizeExactRefs) {
  TypeBuilder builder(10);

  // Types that vary in exactness or nullability of references are different.
  Type a = builder.getTempRefType(builder[0], Nullable, Inexact);
  Type b = builder.getTempRefType(builder[1], NonNullable, Inexact);
  Type c = builder.getTempRefType(builder[2], Nullable, Exact);
  Type d = builder.getTempRefType(builder[3], NonNullable, Exact);

  builder[0] = Struct({Field(a, Mutable)});
  builder[1] = Struct({Field(b, Mutable)});
  builder[2] = Struct({Field(c, Mutable)});
  builder[3] = Struct({Field(d, Mutable)});

  auto translate = [&](HeapType t) -> HeapType {
    for (int i = 0; i < 4; ++i) {
      if (t == builder[i]) {
        return builder[4 + i];
      }
    }
    WASM_UNREACHABLE("unexpected type");
  };

  builder[4].copy(builder[0], translate);
  builder[5].copy(builder[1], translate);
  builder[6].copy(builder[2], translate);
  builder[7].copy(builder[3], translate);

  // Test with references to previous types as well.
  Type ref0 = builder.getTempRefType(builder[0], Nullable, Exact);
  Type ref4 = builder.getTempRefType(builder[4], Nullable, Exact);

  builder[8] = Struct({Field(ref0, Mutable)});
  builder[9] = Struct({Field(ref4, Mutable)});

  auto result = builder.build();
  ASSERT_TRUE(result);
  auto built = *result;

  EXPECT_EQ(built[0], built[4]);
  EXPECT_EQ(built[1], built[5]);
  EXPECT_EQ(built[2], built[6]);
  EXPECT_EQ(built[3], built[7]);

  EXPECT_EQ(built[8], built[9]);

  EXPECT_NE(built[0], built[1]);
  EXPECT_NE(built[0], built[2]);
  EXPECT_NE(built[0], built[3]);
  EXPECT_NE(built[1], built[2]);
  EXPECT_NE(built[1], built[3]);
  EXPECT_NE(built[2], built[3]);
}